

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

bool __thiscall QVariant::toBool(QVariant *this)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  bool bVar3;
  uchar uVar4;
  long in_FS_OFFSET;
  bool res;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<bool>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    uVar4 = (this->d).data.data[0];
  }
  else {
    local_28.d_ptr = local_28.d_ptr & 0xffffffffffffff00;
    uVar2 = *(ulong *)&(this->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),this,local_20,&local_28);
    uVar4 = (uchar)local_28.d_ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::toBool() const
{
    auto boolType = QMetaType::fromType<bool>();
    if (d.type() == boolType)
        return d.get<bool>();

    bool res = false;
    QMetaType::convert(d.type(), constData(), boolType, &res);
    return res;
}